

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

bool load_char_obj(DESCRIPTOR_DATA *d,char *name)

{
  byte *pbVar1;
  long *vector;
  long *vector_00;
  long *vector_01;
  char cVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  CHAR_DATA *nch;
  PC_DATA *pPVar6;
  char *pcVar7;
  long lVar8;
  char **ppcVar9;
  FILE *pFVar10;
  RACE_DATA *pRVar11;
  CClass *pCVar12;
  CProficiencies *pCVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  int returnCode;
  char *local_1268 [2];
  string buffer;
  char strsave [4608];
  
  nch = new_char();
  pPVar6 = new_pcdata();
  nch->pcdata = pPVar6;
  d->character = nch;
  nch->desc = d;
  pPVar6->entering_text = false;
  pcVar7 = palloc_string(name);
  nch->name = pcVar7;
  lVar8 = get_pc_id();
  nch->id = lVar8;
  iVar4 = race_lookup("human");
  nch->race = (short)iVar4;
  nch->level = 0;
  pbVar1 = (byte *)((long)nch->act + 2);
  *pbVar1 = *pbVar1 | 1;
  pbVar1 = (byte *)((long)nch->comm + 1);
  *pbVar1 = *pbVar1 | 0x60;
  zero_vector(nch->pcdata->trust);
  pcVar7 = palloc_string("<%hhp %mm %vmv %L> ");
  nch->prompt = pcVar7;
  for (lVar8 = 0xd6e; pPVar6 = nch->pcdata, lVar8 != 0x1756e; lVar8 = lVar8 + 0x1200) {
    *(undefined1 *)((long)&pPVar6->next + lVar8) = 0;
  }
  pPVar6->read_next = 0;
  pPVar6->write_next = 0;
  pPVar6->pending = false;
  pCVar13 = &pPVar6->profs;
  if (pPVar6 == (PC_DATA *)0x0) {
    pCVar13 = &prof_none;
  }
  CProficiencies::SetChar(pCVar13,nch);
  pCVar13 = &nch->pcdata->profs;
  if (nch->pcdata == (PC_DATA *)0x0) {
    pCVar13 = &prof_none;
  }
  CProficiencies::SetPATime(pCVar13,0);
  pPVar6 = nch->pcdata;
  pPVar6->confirm_delete = false;
  pPVar6->pwd = (char *)0x0;
  pcVar7 = palloc_string("");
  nch->pcdata->bamfin = pcVar7;
  pcVar7 = palloc_string("");
  nch->pcdata->bamfout = pcVar7;
  pcVar7 = palloc_string("");
  pPVar6 = nch->pcdata;
  pPVar6->title = pcVar7;
  pPVar6->roll_time = current_time;
  pPVar6->birth_date = 0x5ec;
  pPVar6->death_time = 500;
  pPVar6->style = 0;
  zero_vector(pPVar6->styles);
  for (lVar8 = 0x134; lVar8 != 0x139; lVar8 = lVar8 + 1) {
    *(undefined2 *)((long)&nch->next + lVar8 * 2) = 0xd;
  }
  pPVar6 = nch->pcdata;
  for (lVar8 = 0; lVar8 != 0x15; lVar8 = lVar8 + 1) {
    pPVar6->sect_time[lVar8] = 0;
  }
  for (lVar8 = 0; lVar8 != 5; lVar8 = lVar8 + 1) {
    pPVar6->deposited_items[lVar8] = 0;
  }
  pPVar6->security = 0;
  pPVar6->bounty = 0;
  pPVar6->bounty_credits = 0;
  pPVar6->condition[1] = 0;
  pPVar6->condition[2] = 0;
  pPVar6->condition[3] = 0;
  pPVar6->condition[4] = 0;
  pPVar6->condition[5] = 0;
  nch->bounty_timer = 0;
  pPVar6->end_fun = (DO_FUN *)0x0;
  pPVar6->energy_state = 0;
  nch->dam_mod = 100.0;
  pPVar6->shifted = -1;
  nch->defense_mod = 0;
  pPVar6->tribe = 0;
  pPVar6->save_timer = 0;
  nch->disrupted = false;
  nch->stolen_from = false;
  pPVar6->souls = 0;
  nch->position = 0;
  pPVar6->cabal_level = 0;
  pPVar6->bounty_killed = 0;
  pPVar6->paladin_path = 0;
  pPVar6->editing_item = 0;
  for (lVar8 = 0x16; lVar8 != 0x7a; lVar8 = lVar8 + 1) {
    (&nch->pcdata->next)[lVar8] = (PC_DATA *)0x0;
  }
  ppcVar9 = &color_event[0].default_color;
  for (lVar8 = 0; lVar8 != 0xd; lVar8 = lVar8 + 1) {
    nch->pcdata->color_scheme[lVar8] = *ppcVar9;
    ppcVar9 = ppcVar9 + 3;
  }
  pPVar6 = nch->pcdata;
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    pPVar6->quests[lVar8] = 0;
  }
  fclose((FILE *)fpReserve);
  pcVar7 = capitalize(name);
  sprintf(strsave,"%s%s%s","../player",pcVar7,".gz");
  pFVar10 = fopen(strsave,"r");
  if (pFVar10 != (FILE *)0x0) {
    fclose(pFVar10);
    fmt_01.size_ = 0xc;
    fmt_01.data_ = (char *)0xc;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_1268;
    local_1268[0] = strsave;
    ::fmt::v9::vformat_abi_cxx11_(&buffer,(v9 *)"gzip -dfq {}",fmt_01,args);
    returnCode = system(buffer._M_dataplus._M_p);
    if (returnCode != 0) {
      local_1268[0] = buffer._M_dataplus._M_p;
      fmt._M_str = "Command [{}] failed with exit code [{}]";
      fmt._M_len = 0x27;
      CLogger::Warn<char*,int&>((CLogger *)&RS.field_0x140,fmt,local_1268,&returnCode);
    }
    std::__cxx11::string::~string((string *)&buffer);
  }
  pcVar7 = capitalize(name);
  sprintf(strsave,"%s/%s.plr","../player",pcVar7);
  pFVar10 = fopen(strsave,"r");
  if (pFVar10 != (FILE *)0x0) {
    for (lVar8 = 0; lVar8 != 800; lVar8 = lVar8 + 8) {
      *(undefined8 *)((long)rgObjNest + lVar8) = 0;
    }
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while (cVar2 = fread_letter((FILE *)pFVar10), cVar2 != '#') {
              if (cVar2 != '*') {
                pcVar7 = "Load_char_obj: # not found.";
                goto LAB_003125c5;
              }
              fread_to_eol((FILE *)pFVar10);
            }
            pcVar7 = fread_word((FILE *)pFVar10);
            bVar3 = str_cmp(pcVar7,"PLAYER");
            if (bVar3) break;
            fread_char(nch,(FILE *)pFVar10);
          }
          bVar3 = str_cmp(pcVar7,"OBJECT");
          if ((bVar3) && (bVar3 = str_cmp(pcVar7,"O"), bVar3)) break;
          fread_obj(nch,(FILE *)pFVar10);
        }
        bVar3 = str_cmp(pcVar7,"CHARMED");
        if (bVar3) break;
        fread_charmie(nch,(FILE *)pFVar10);
      }
      bVar3 = str_cmp(pcVar7,"PET");
      if (bVar3) break;
      fread_pet(nch,(FILE *)pFVar10);
    }
    bVar3 = str_cmp(pcVar7,"END");
    if (bVar3) {
      pcVar7 = "Load_char_obj: bad section.";
LAB_003125c5:
      fmt_00._M_str = pcVar7;
      fmt_00._M_len = 0x1b;
      CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt_00);
    }
    fclose(pFVar10);
  }
  free_pstring(nch->true_name);
  pcVar7 = palloc_string(name);
  nch->true_name = pcVar7;
  free_pstring(nch->backup_true_name);
  pcVar7 = palloc_string(name);
  nch->backup_true_name = pcVar7;
  fpReserve = (FILE *)fopen("/dev/null","r");
  vector = nch->imm_flags;
  zero_vector(vector);
  vector_00 = nch->res_flags;
  zero_vector(vector_00);
  vector_01 = nch->vuln_flags;
  zero_vector(vector_01);
  if (pFVar10 == (FILE *)0x0) {
    BITWISE_OR(vector,limmune_flags);
    BITWISE_OR(vector_00,lres_flags);
    BITWISE_OR(vector_01,lvuln_flags);
  }
  else {
    uVar5 = (uint)(ushort)nch->race;
    if (nch->race == 0) {
      uVar5 = race_lookup("human");
      nch->race = (short)uVar5;
    }
    nch->size = pc_race_table[(short)uVar5].size;
    nch->dam_type = 0x11;
    for (lVar8 = 0;
        (lVar8 != 5 &&
        (pcVar7 = *(char **)((long)(short)uVar5 * 0x88 + 0x4f0f50 + lVar8 * 8),
        pcVar7 != (char *)0x0)); lVar8 = lVar8 + 1) {
      group_add(nch,pcVar7,false);
      uVar5 = (uint)(ushort)nch->race;
    }
    pRVar11 = race_data_lookup((int)(short)uVar5);
    BITWISE_OR(nch->affected_by,pRVar11->aff);
    pRVar11 = race_data_lookup((int)nch->race);
    BITWISE_OR(vector,pRVar11->imm);
    pRVar11 = race_data_lookup((int)nch->race);
    BITWISE_OR(vector_00,pRVar11->res);
    pRVar11 = race_data_lookup((int)nch->race);
    BITWISE_OR(vector_01,pRVar11->vuln);
    pRVar11 = race_data_lookup((int)nch->race);
    copy_vector(nch->form,pRVar11->form);
    pRVar11 = race_data_lookup((int)nch->race);
    copy_vector(nch->parts,pRVar11->parts);
    BITWISE_OR(vector,limmune_flags);
    BITWISE_OR(vector_00,lres_flags);
    BITWISE_OR(vector_01,lvuln_flags);
    if (nch->version < 2) {
      pCVar12 = char_data::Class(nch);
      pcVar7 = RString::operator_cast_to_char_(&pCVar12->base_group);
      group_add(nch,pcVar7,false);
      pCVar12 = char_data::Class(nch);
      pcVar7 = RString::operator_cast_to_char_(&pCVar12->default_group);
      group_add(nch,pcVar7,true);
      nch->pcdata->learned[gsn_recall] = 0x32;
    }
  }
  return pFVar10 != (FILE *)0x0;
}

Assistant:

bool load_char_obj(DESCRIPTOR_DATA *d, char *name)
{
	char strsave[MAX_INPUT_LENGTH];
	CHAR_DATA *ch;
	FILE *fp;
	bool found;
	int stat;
	int pos;
	int i;

	CHAR_DATA *charg = new CHAR_DATA;

	ch = new_char();
	ch->pcdata = new_pcdata();

	d->character = ch;
	ch->desc = d;
	ch->pcdata->entering_text = false;
	ch->name = palloc_string(name);
	ch->id = get_pc_id();
	ch->race = race_lookup("human");
	ch->level = 0;

	SET_BIT(ch->act, PLR_NOSUMMON);
	SET_BIT(ch->comm, COMM_COMBINE);
	SET_BIT(ch->comm, COMM_PROMPT);

	zero_vector(ch->pcdata->trust);

	ch->prompt = palloc_string("<%hhp %mm %vmv %L> ");

	for (i = 0; i < 20; i++)
	{
		ch->pcdata->queue[i][0] = '\0';
	}

	ch->pcdata->read_next = 0;
	ch->pcdata->write_next = 0;
	ch->pcdata->pending = 0;
	ch->Profs()->SetChar(ch);
	ch->Profs()->SetPATime(0);
	ch->pcdata->confirm_delete = false;
	ch->pcdata->pwd = nullptr;
	ch->pcdata->bamfin = palloc_string("");
	ch->pcdata->bamfout = palloc_string("");
	ch->pcdata->title = palloc_string("");
	ch->pcdata->roll_time = current_time;
	ch->pcdata->birth_date = 1516; // rs starts in 1515
	ch->pcdata->death_time = 500;
	ch->pcdata->style = 0;

	zero_vector(ch->pcdata->styles);

	for (stat = 0; stat < MAX_STATS; stat++)
	{
		ch->perm_stat[stat] = 13;
	}

	for (stat = 0; stat < SECT_MAX; stat++)
	{
		ch->pcdata->sect_time[stat] = 0;
	}

	for (stat = 0; stat < MAX_STORED_ITEMS; stat++)
	{
		ch->pcdata->deposited_items[stat] = 0;
	}

	ch->pcdata->condition[COND_THIRST] = 0;
	ch->pcdata->condition[COND_FULL] = 0;
	ch->pcdata->condition[COND_HUNGER] = 0;
	ch->pcdata->condition[COND_STARVING] = 0;
	ch->pcdata->condition[COND_DEHYDRATED] = 0;
	ch->pcdata->security = 0; /* OLC */
	ch->pcdata->bounty = 0;
	ch->pcdata->bounty_credits = 0;
	ch->bounty_timer = 0;
	ch->pcdata->end_fun = nullptr;
	ch->pcdata->energy_state = 0;
	ch->dam_mod = 100;
	ch->pcdata->shifted = -1;
	ch->defense_mod = 0;
	ch->pcdata->tribe = 0;
	ch->pcdata->save_timer = 0;
	ch->disrupted = false;
	ch->stolen_from = false;
	ch->pcdata->souls = 0;
	ch->position = 0;
	ch->pcdata->cabal_level = 0;
	ch->pcdata->bounty_killed = 0;
	ch->pcdata->paladin_path = 0;
	ch->pcdata->editing_item = 0;

	for (pos = 0; pos < 100; pos++)
	{
		ch->pcdata->recentkills[pos] = nullptr;
	}

	for (pos = 0; pos < MAX_EVENTS; pos++)
	{
		ch->pcdata->color_scheme[pos] = color_event[pos].default_color;
	}

	for (pos = 0; pos < MAX_QUESTS; pos++)
	{
		ch->pcdata->quests[pos] = 0;
	}

	found = false;

	fclose(fpReserve);

	/* decompress if .gz file exists */
	sprintf(strsave, "%s%s%s", RIFT_PLAYER_DIR, capitalize(name), ".gz");

	if ((fp = fopen(strsave, "r")) != nullptr)
	{
		fclose(fp);

		auto buffer = fmt::format("gzip -dfq {}", strsave);

		auto returnCode = system(buffer.c_str());
		if(returnCode != 0) // gzip returns 0 on SUCCESS, 1 on ERROR. system returns -1 on ERROR
			RS.Logger.Warn("Command [{}] failed with exit code [{}]", buffer.data(), returnCode);
	}

	sprintf(strsave, "%s/%s.plr", RIFT_PLAYER_DIR, capitalize(name));

	if ((fp = fopen(strsave, "r")) != nullptr)
	{
		int iNest;

		for (iNest = 0; iNest < MAX_NEST; iNest++)
			rgObjNest[iNest] = nullptr;

		found = true;

		for (;;)
		{
			char letter;
			char *word;

			letter = fread_letter(fp);
			if (letter == '*')
			{
				fread_to_eol(fp);
				continue;
			}

			if (letter != '#')
			{
				RS.Logger.Warn("Load_char_obj: # not found.");
				break;
			}

			word = fread_word(fp);

			if (!str_cmp(word, "PLAYER"))
			{
				fread_char(ch, fp);
			}
			else if (!str_cmp(word, "OBJECT"))
			{
				fread_obj(ch, fp);
			}
			else if (!str_cmp(word, "O"))
			{
				fread_obj(ch, fp);
			}
			else if (!str_cmp(word, "CHARMED"))
			{
				fread_charmie(ch, fp);
			}
			else if (!str_cmp(word, "PET"))
			{
				fread_pet(ch, fp);
			}
			else if (!str_cmp(word, "END"))
			{
				break;
			}
			else
			{
				RS.Logger.Warn("Load_char_obj: bad section.");
				break;
			}
		}

		fclose(fp);
	}

	free_pstring(ch->true_name);
	ch->true_name = palloc_string(name);

	free_pstring(ch->backup_true_name);
	ch->backup_true_name = palloc_string(name);

	fpReserve = fopen(NULL_FILE, "r");

	/* Morg - Valgrind fix */
	zero_vector(ch->imm_flags);
	zero_vector(ch->res_flags);
	zero_vector(ch->vuln_flags);

	/* initialize race */
	if (found)
	{
		int i;

		if (ch->race == 0)
			ch->race = race_lookup("human");

		ch->size = pc_race_table[ch->race].size;
		ch->dam_type = 17; /*punch */

		for (i = 0; i < 5; i++)
		{
			if (pc_race_table[ch->race].skills[i] == nullptr)
				break;

			group_add(ch, pc_race_table[ch->race].skills[i], false);
		}

		BITWISE_OR(ch->affected_by, race_data_lookup(ch->race)->aff);
		BITWISE_OR(ch->imm_flags, race_data_lookup(ch->race)->imm);
		BITWISE_OR(ch->res_flags, race_data_lookup(ch->race)->res);
		BITWISE_OR(ch->vuln_flags, race_data_lookup(ch->race)->vuln);

		copy_vector(ch->form, race_data_lookup(ch->race)->form);
		copy_vector(ch->parts, race_data_lookup(ch->race)->parts);
	}

	BITWISE_OR(ch->imm_flags, limmune_flags);
	BITWISE_OR(ch->res_flags, lres_flags);
	BITWISE_OR(ch->vuln_flags, lvuln_flags);

	/* RT initialize skills */

	if (found && ch->version < 2) /* need to add the new skills */
	{
		group_add(ch, ch->Class()->base_group, false);
		group_add(ch, ch->Class()->default_group, true);
		ch->pcdata->learned[gsn_recall] = 50;
	}

	return found;
}